

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CircularBuffer.h
# Opt level: O2

size_t __thiscall
axl::sl::CircularBufferBase<char>::dropFront(CircularBufferBase<char> *this,size_t length)

{
  ulong uVar1;
  
  uVar1 = this->m_length;
  if (uVar1 < length) {
    length = uVar1;
  }
  this->m_front =
       (this->m_front + length) %
       (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
  this->m_length = uVar1 - length;
  return length;
}

Assistant:

size_t
	dropFront(size_t length) {
		if (length > m_length)
			length = m_length;

		m_front = (m_front + length) % m_buffer.getCount();
		m_length -= length;

		ASSERT(isValid());
		return length;
	}